

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_to_hex.h
# Opt level: O3

void __thiscall
fmt::v11::
formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
::put_newline<fmt::v11::basic_appender<char>>
          (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
           *this,basic_appender<char> inserter,size_t pos)

{
  format_string_checker<char,_1,_0,_false> *handler;
  size_t sVar1;
  buffer<char> *buf;
  ulong uVar2;
  basic_string_view<char> fmt;
  string_view fmt_00;
  format_args args;
  size_t local_68 [2];
  undefined4 local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined1 *local_38;
  code *local_30;
  
  sVar1 = (inserter.container)->size_;
  uVar2 = sVar1 + 1;
  if ((inserter.container)->capacity_ < uVar2) {
    (*(inserter.container)->grow_)(inserter.container,uVar2);
    sVar1 = (inserter.container)->size_;
    uVar2 = sVar1 + 1;
  }
  handler = (format_string_checker<char,_1,_0,_false> *)(inserter.container)->ptr_;
  (inserter.container)->size_ = uVar2;
  *(undefined1 *)((long)handler->types_ + sVar1) = 10;
  if (this[4] ==
      (formatter<spdlog::details::dump_info<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>,char,void>
       )0x1) {
    local_68[0] = CONCAT44(local_68[0]._4_4_,4);
    local_68[1] = 0;
    local_58 = 0;
    local_50 = "{:04X}: ";
    local_48 = 8;
    local_40 = 0x100000000;
    local_30 = detail::invoke_parse<unsigned_long&,char>;
    fmt.size_ = (size_t)local_68;
    fmt.data_ = (char *)0x8;
    local_38 = (undefined1 *)local_68;
    detail::parse_format_string<char,fmt::v11::detail::format_string_checker<char,1,0,false>>
              ((detail *)"{:04X}: ",fmt,handler);
    fmt_00.size_ = 8;
    fmt_00.data_ = "{:04X}: ";
    args.field_1.values_ = (value<fmt::v11::context> *)local_68;
    args.desc_ = 4;
    local_68[0] = pos;
    detail::vformat_to(inserter.container,fmt_00,args,(locale_ref)0x0);
  }
  return;
}

Assistant:

void put_newline(It inserter, std::size_t pos) const {
#ifdef _WIN32
        *inserter++ = '\r';
#endif
        *inserter++ = '\n';

        if (put_positions) {
            spdlog::fmt_lib::format_to(inserter, SPDLOG_FMT_STRING("{:04X}: "), pos);
        }
    }